

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O1

QCollator * __thiscall
anon_unknown.dwarf_bfbbce::GenerationalCollator::collator(GenerationalCollator *this)

{
  QCollator QVar1;
  long in_FS_OFFSET;
  QCollator moved;
  QCollator local_28;
  QCollator local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Type)this->generation !=
      (__atomic_base<int>)QLocalePrivate::s_generation._q_value.super___atomic_base<int>._M_i) {
    this->generation = (int)QLocalePrivate::s_generation._q_value.super___atomic_base<int>._M_i;
    QCollator::QCollator(&local_28);
    QVar1.d = local_28.d;
    local_28.d = (QCollatorPrivate *)0x0;
    local_20.d = (this->theCollator).d;
    (this->theCollator).d = QVar1.d;
    QCollator::~QCollator(&local_20);
    QCollator::~QCollator(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return &this->theCollator;
  }
  __stack_chk_fail();
}

Assistant:

QCollator &collator()
    {
        int currentGeneration = QLocalePrivate::s_generation.loadRelaxed();
        if (Q_UNLIKELY(generation != currentGeneration)) {
            // reinitialize the collator
            generation = currentGeneration;
            theCollator = QCollator();
        }
        return theCollator;
    }